

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O3

void __thiscall Imf_3_4::Context::Context(Context *this)

{
  element_type *pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  pp_Var1 = (element_type *)operator_new(8);
  *pp_Var1 = (element_type)0x0;
  (this->_ctxt).super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pp_Var1;
  (this->_ctxt).super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001e3040;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)pp_Var1;
  (this->_ctxt).super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  return;
}

Assistant:

Context::Context ()
    : _ctxt (new exr_context_t(), [] (exr_context_t* todel) {
        exr_finish (todel);
        delete todel;
    })
{
}